

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  size_type __n;
  size_type __n_00;
  ulong uVar4;
  StringPiece x;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  string local_b0;
  string local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_50;
  
  GetParts(&local_50,this,lhs);
  GetParts(&local_70,this,rhs);
  local_b0._0_16_ =
       stringpiece_internal::StringPiece::substr(&local_50.first,0,local_70.first.length_);
  x = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_50.first.length_);
  iVar2 = stringpiece_internal::StringPiece::compare((StringPiece *)&local_b0,x);
  if (iVar2 != 0) {
    return SUB41((uint)iVar2 >> 0x1f,0);
  }
  if (local_50.first.length_ == local_70.first.length_) {
    __n = local_70.second.length_;
    if (local_50.second.length_ < local_70.second.length_) {
      __n = local_50.second.length_;
    }
    iVar2 = memcmp(local_50.second.ptr_,local_70.second.ptr_,__n);
    if (iVar2 < 0) {
      return true;
    }
    return iVar2 == 0 && local_50.second.length_ < local_70.second.length_;
  }
  SymbolEntry::AsString_abi_cxx11_(&local_b0,lhs,this->index);
  SymbolEntry::AsString_abi_cxx11_(&local_90,rhs,this->index);
  sVar1 = local_b0._M_string_length;
  __n_00 = local_b0._M_string_length;
  if (local_90._M_string_length < local_b0._M_string_length) {
    __n_00 = local_90._M_string_length;
  }
  if (__n_00 != 0) {
    uVar3 = memcmp(local_b0._M_dataplus._M_p,local_90._M_dataplus._M_p,__n_00);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_003885bb;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(sVar1 - local_90._M_string_length)) {
    uVar4 = sVar1 - local_90._M_string_length;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0;
  }
LAB_003885bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((StringPiece *)local_b0._M_dataplus._M_p != (StringPiece *)&local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }